

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void testing::internal::InitGoogleTestImpl<wchar_t>(int *argc,wchar_t **argv)

{
  int iVar1;
  ulong uVar2;
  wchar_t **streamable;
  bool bVar3;
  String local_40;
  
  iVar1 = g_init_gtest_count + 1;
  bVar3 = g_init_gtest_count == 0;
  g_init_gtest_count = iVar1;
  if ((bVar3) && (0 < *argc)) {
    StreamableToString<wchar_t*>((internal *)&local_40,argv);
    String::operator=((String *)g_executable_path,&local_40);
    if (local_40.c_str_ != (char *)0x0) {
      operator_delete__(local_40.c_str_);
    }
    std::vector<testing::internal::String,_std::allocator<testing::internal::String>_>::clear
              ((vector<testing::internal::String,_std::allocator<testing::internal::String>_> *)
               g_argvs);
    if (*argc != 0) {
      uVar2 = 0;
      streamable = argv;
      do {
        StreamableToString<wchar_t*>((internal *)&local_40,streamable);
        std::vector<testing::internal::String,_std::allocator<testing::internal::String>_>::
        emplace_back<testing::internal::String>
                  ((vector<testing::internal::String,_std::allocator<testing::internal::String>_> *)
                   g_argvs,&local_40);
        if (local_40.c_str_ != (char *)0x0) {
          operator_delete__(local_40.c_str_);
        }
        uVar2 = uVar2 + 1;
        streamable = streamable + 1;
      } while (uVar2 != (uint)*argc);
    }
    ParseGoogleTestFlagsOnlyImpl<wchar_t>(argc,argv);
    UnitTest::GetInstance();
    UnitTestImpl::PostFlagParsingInit(UnitTest::GetInstance::instance.impl_);
  }
  return;
}

Assistant:

void InitGoogleTestImpl(int* argc, CharType** argv) {
  g_init_gtest_count++;

  // We don't want to run the initialization code twice.
  if (g_init_gtest_count != 1) return;

  if (*argc <= 0) return;

  internal::g_executable_path = internal::StreamableToString(argv[0]);

#if GTEST_HAS_DEATH_TEST

  g_argvs.clear();
  for (int i = 0; i != *argc; i++) {
    g_argvs.push_back(StreamableToString(argv[i]));
  }

#endif  // GTEST_HAS_DEATH_TEST

  ParseGoogleTestFlagsOnly(argc, argv);
  GetUnitTestImpl()->PostFlagParsingInit();
}